

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol ** Symbol_arrayof(void)

{
  uint uVar1;
  s_x2 *psVar2;
  symbol **ppsVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar2 = x2a;
  if (x2a != (s_x2 *)0x0) {
    uVar1 = x2a->count;
    ppsVar3 = (symbol **)calloc((long)(int)uVar1,8);
    uVar4 = 0;
    if (ppsVar3 != (symbol **)0x0) {
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 * 8 != uVar4; uVar4 = uVar4 + 8) {
        *(undefined8 *)((long)ppsVar3 + uVar4) =
             *(undefined8 *)((long)&psVar2->tbl->data + uVar4 * 4);
      }
      return ppsVar3;
    }
  }
  return (symbol **)0x0;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,size;
  if( x2a==0 ) return 0;
  size = x2a->count;
  array = (struct symbol **)calloc(size, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}